

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

bool settings::find(char *s,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *vector_of_words)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  
  pbVar1 = (vector_of_words->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (vector_of_words->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar4 = pbVar2;
    if (pbVar4 == pbVar1) break;
    iVar3 = strcmp(s,(pbVar4->_M_dataplus)._M_p);
    pbVar2 = pbVar4 + 1;
  } while (iVar3 != 0);
  return pbVar4 != pbVar1;
}

Assistant:

bool find(const char * s, const vector<string> & vector_of_words)
  {
    for (auto && val : vector_of_words)
      if (!strcmp(s, val.c_str()))
        return true;

    return false;
  }